

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_seek(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  long lVar1;
  int iVar2;
  int iVar3;
  JSContext *ctx_00;
  int *piVar4;
  undefined4 in_ECX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  int32_t *in_R8;
  JSValue JVar5;
  BOOL is_bigint;
  int64_t ret;
  int64_t pos;
  int whence;
  int fd;
  JSValue v;
  undefined4 in_stack_ffffffffffffff48;
  JSValueUnion in_stack_ffffffffffffff50;
  __off_t in_stack_ffffffffffffff58;
  int local_a0;
  int local_9c;
  undefined4 in_stack_ffffffffffffff70;
  JSValueUnion local_70;
  int64_t local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  JVar5.tag = in_RSI;
  JVar5.u.ptr = in_RDI.ptr;
  iVar2 = JS_ToInt32((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffff70),in_R8,JVar5);
  lVar1 = local_70;
  if (iVar2 == 0) {
    iVar2 = JS_IsBigInt((JSContext *)in_RDI.ptr,*(JSValue *)(in_R8 + 4));
    val.tag = in_stack_ffffffffffffff58;
    val.u.float64 = in_stack_ffffffffffffff50.float64;
    iVar3 = JS_ToInt64Ext((JSContext *)CONCAT44(iVar2,in_stack_ffffffffffffff48),(int64_t *)0x11450c
                          ,val);
    if (iVar3 == 0) {
      val_00.tag = in_RSI;
      val_00.u.ptr = in_RDI.ptr;
      iVar3 = JS_ToInt32((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffff70),in_R8,val_00);
      if (iVar3 == 0) {
        ctx_00 = (JSContext *)lseek(local_9c,in_stack_ffffffffffffff58,local_a0);
        if (ctx_00 == (JSContext *)0xffffffffffffffff) {
          piVar4 = __errno_location();
          ctx_00 = (JSContext *)(long)-*piVar4;
        }
        if (iVar2 == 0) {
          if (ctx_00 == (JSContext *)(long)(int)ctx_00) {
            local_30._4_4_ = uStack_c;
            local_30.int32 = (int)ctx_00;
            local_28 = 0;
          }
          else {
            JVar5 = __JS_NewFloat64((JSContext *)in_RDI.ptr,(double)(long)ctx_00);
            local_60 = JVar5.u;
            local_30 = local_60;
            local_58 = JVar5.tag;
            local_28 = local_58;
          }
          local_68 = local_28;
          local_70.float64 = local_30.float64;
        }
        else {
          _local_70 = JS_NewBigInt64(ctx_00,CONCAT44(iVar2,in_stack_ffffffffffffff48));
        }
      }
      else {
        local_70.ptr = (void *)(lVar1 << 0x20);
        local_68 = 6;
      }
    }
    else {
      local_70.ptr = (void *)(lVar1 << 0x20);
      local_68 = 6;
    }
  }
  else {
    local_70.ptr = (void *)(lVar1 << 0x20);
    local_68 = 6;
  }
  return _local_70;
}

Assistant:

static JSValue js_os_seek(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    int fd, whence;
    int64_t pos, ret;
    BOOL is_bigint;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    is_bigint = JS_IsBigInt(ctx, argv[1]);
    if (JS_ToInt64Ext(ctx, &pos, argv[1]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &whence, argv[2]))
        return JS_EXCEPTION;
    ret = lseek(fd, pos, whence);
    if (ret == -1)
        ret = -errno;
    if (is_bigint)
        return JS_NewBigInt64(ctx, ret);
    else
        return JS_NewInt64(ctx, ret);
}